

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O3

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateResult<mp::QuadAndLinTerms,mp::AlgConRhs<0>>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *con,Context ctx)

{
  Context ctx_00;
  double lb;
  double ub;
  
  lb = (con->super_AlgConRhs<0>).rhs_;
  if (lb <= -1e+20) {
    ctx_00.value_ = CTX_NEG;
    if (CTX_POS < ctx.value_) {
      lb = -INFINITY;
      ub = INFINITY;
      ctx_00.value_ = ctx.value_;
      if (ctx.value_ == CTX_NEG) {
        ctx_00.value_ = CTX_POS;
      }
      goto LAB_0035cd2b;
    }
  }
  else {
    ctx_00.value_ = CTX_MIX;
    if ((1e+20 <= lb) && (ctx_00.value_ = CTX_POS, CTX_POS < ctx.value_)) {
      ctx_00.value_ = ctx.value_;
    }
  }
  ub = lb;
  if (ctx.value_ != CTX_ROOT) {
    lb = -INFINITY;
    ub = INFINITY;
  }
LAB_0035cd2b:
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::PropagateResult2QuadAndLinTerms
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&con->super_QuadAndLinTerms,lb,ub,ctx_00);
  return;
}

Assistant:

double rhs() const { return rhs_; }